

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

void __thiscall duckdb::ParquetOptions::ParquetOptions(ParquetOptions *this,ClientContext *context)

{
  char cVar1;
  bool bVar2;
  Value binary_as_string_val;
  LogicalType aLStack_98 [24];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  Value local_60 [64];
  
  this->binary_as_string = false;
  this->file_row_number = false;
  (this->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->debug_use_openssl = true;
  (this->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->explicit_cardinality = 0;
  duckdb::LogicalType::LogicalType(aLStack_98,SQLNULL);
  duckdb::Value::Value(local_60,aLStack_98);
  duckdb::LogicalType::~LogicalType(aLStack_98);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"binary_as_string","");
  cVar1 = duckdb::ClientContext::TryGetCurrentSetting((string *)context,(Value *)local_80);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (cVar1 != '\x03') {
    bVar2 = duckdb::Value::GetValue<bool>();
    this->binary_as_string = bVar2;
  }
  duckdb::Value::~Value(local_60);
  return;
}

Assistant:

ParquetOptions::ParquetOptions(ClientContext &context) {
	Value binary_as_string_val;
	if (context.TryGetCurrentSetting("binary_as_string", binary_as_string_val)) {
		binary_as_string = binary_as_string_val.GetValue<bool>();
	}
}